

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O0

void Frc_ManPlacementRefine(Frc_Man_t *p,int nIters,int fVerbose)

{
  float fVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  abctime aVar5;
  abctime aVar6;
  bool bVar7;
  long local_a8;
  abctime clk2Total;
  abctime clk2;
  abctime clk;
  int nCutPrev;
  int nCutCur2;
  int nCutCur;
  int nCutStart;
  int Counter;
  int iMaxX;
  int iMinX;
  int Iter;
  int h;
  int k;
  int *pHandles;
  int *pPermX;
  float *pfStack_50;
  float VertX;
  float *pVertX;
  double CostPrev;
  double CostThis;
  Frc_Obj_t *pNext;
  Frc_Obj_t *pThis;
  Vec_Int_t *vCoOrder;
  int local_18;
  int fRandomize;
  int fVerbose_local;
  int nIters_local;
  Frc_Man_t *p_local;
  
  vCoOrder._4_4_ = 0;
  local_18 = fVerbose;
  fRandomize = nIters;
  _fVerbose_local = p;
  aVar4 = Abc_Clock();
  local_a8 = 0;
  pThis = (Frc_Obj_t *)Frc_ManCollectCos(_fVerbose_local);
  if (vCoOrder._4_4_ != 0) {
    Frc_ManArrayShuffle((Vec_Int_t *)pThis);
  }
  clk._0_4_ = Frc_ManPlaceDfsBoth(_fVerbose_local,(Vec_Int_t *)pThis,(int *)((long)&clk + 4));
  pVertX = (float *)0x0;
  nCutCur2 = (int)clk;
  _h = (int *)malloc((long)_fVerbose_local->nObjs << 2);
  pfStack_50 = (float *)malloc((long)_fVerbose_local->nObjs << 2);
  iMaxX = 0;
  while( true ) {
    if (fRandomize <= iMaxX) {
      if (_h != (int *)0x0) {
        free(_h);
        _h = (int *)0x0;
      }
      if (pfStack_50 != (float *)0x0) {
        free(pfStack_50);
        pfStack_50 = (float *)0x0;
      }
      Vec_IntFree((Vec_Int_t *)pThis);
      return;
    }
    CostPrev = 0.0;
    iMinX = 0;
    while( true ) {
      bVar7 = false;
      if (iMinX < _fVerbose_local->nObjData) {
        pNext = Frc_ManObj(_fVerbose_local,iMinX);
        bVar7 = pNext != (Frc_Obj_t *)0x0;
      }
      if (!bVar7) break;
      nCutStart = pNext->pPlace;
      Iter = 0;
      Counter = nCutStart;
      while( true ) {
        bVar7 = false;
        if (Iter < (int)pNext->nFanouts) {
          CostThis = (double)Frc_ObjFanout(pNext,Iter);
          bVar7 = (Frc_Obj_t *)CostThis != (Frc_Obj_t *)0x0;
        }
        if (!bVar7) break;
        Counter = Abc_MinInt(Counter,*(int *)((long)CostThis + 0x10));
        nCutStart = Abc_MaxInt(nCutStart,*(int *)((long)CostThis + 0x10));
        Iter = Iter + 1;
      }
      (pNext->field_9).fEdgeCenter = (float)(nCutStart + Counter) * 0.5;
      CostPrev = (double)(nCutStart - Counter) + CostPrev;
      iVar3 = Frc_ObjSize(pNext);
      iMinX = iVar3 + iMinX;
    }
    nCutCur = 0;
    iMinX = 0;
    while( true ) {
      bVar7 = false;
      if (iMinX < _fVerbose_local->nObjData) {
        pNext = Frc_ManObj(_fVerbose_local,iMinX);
        bVar7 = pNext != (Frc_Obj_t *)0x0;
      }
      iVar3 = nCutCur;
      if (!bVar7) break;
      pPermX._4_4_ = (pNext->field_9).fEdgeCenter;
      Iter = 0;
      while( true ) {
        bVar7 = false;
        if (Iter < (int)(*(uint *)pNext >> 4)) {
          CostThis = (double)Frc_ObjFanin(pNext,Iter);
          bVar7 = (Frc_Obj_t *)CostThis != (Frc_Obj_t *)0x0;
        }
        fVar1 = pPermX._4_4_;
        if (!bVar7) break;
        pPermX._4_4_ = *(float *)((long)CostThis + 0x14) + pPermX._4_4_;
        Iter = Iter + 1;
      }
      iVar3 = Frc_ObjFaninNum(pNext);
      pfStack_50[nCutCur] = fVar1 / (float)(iVar3 + 1);
      _h[nCutCur] = iMinX;
      nCutCur = nCutCur + 1;
      iVar3 = Frc_ObjSize(pNext);
      iMinX = iVar3 + iMinX;
    }
    iVar2 = Frc_ManObjNum(_fVerbose_local);
    if (iVar3 != iVar2) break;
    aVar5 = Abc_Clock();
    pHandles = Gia_SortFloats(pfStack_50,_h,_fVerbose_local->nObjs);
    aVar6 = Abc_Clock();
    local_a8 = (aVar6 - aVar5) + local_a8;
    if (pHandles != _h) {
      __assert_fail("pPermX == pHandles",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaForce.c"
                    ,0x3a8,"void Frc_ManPlacementRefine(Frc_Man_t *, int, int)");
    }
    Vec_IntClear((Vec_Int_t *)pThis);
    for (Iter = 0; Iter < _fVerbose_local->nObjs; Iter = Iter + 1) {
      pNext = Frc_ManObj(_fVerbose_local,pHandles[Iter]);
      pNext->pPlace = Iter;
      iVar3 = Frc_ObjIsCo(pNext);
      if (iVar3 != 0) {
        Vec_IntPush((Vec_Int_t *)pThis,pNext->hHandle);
      }
    }
    nCutPrev = Frc_ManPlaceDfsBoth(_fVerbose_local,(Vec_Int_t *)pThis,(int *)((long)&clk + 4));
    if (local_18 != 0) {
      printf("%2d : Span = %e  ",CostPrev,(ulong)(iMaxX + 1));
      printf("Cut = %6d  (%5.2f %%)  CutR = %6d  ",
             ((double)(nCutCur2 - nCutPrev) * 100.0) / (double)nCutCur2,(ulong)(uint)nCutPrev,
             (ulong)clk._4_4_);
      Abc_Print(1,"%s =","Total");
      aVar5 = Abc_Clock();
      Abc_Print(1,"%9.2f sec  ",((double)(aVar5 - aVar4) * 1.0) / 1000000.0);
      Abc_Print(1,"%s =","Sort");
      Abc_Print(1,"%9.2f sec\n",((double)local_a8 * 1.0) / 1000000.0);
    }
    clk._0_4_ = nCutPrev;
    iMaxX = iMaxX + 1;
  }
  __assert_fail("Counter == Frc_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaForce.c"
                ,0x3a3,"void Frc_ManPlacementRefine(Frc_Man_t *, int, int)");
}

Assistant:

void Frc_ManPlacementRefine( Frc_Man_t * p, int nIters, int fVerbose )
{
    int fRandomize = 0;
    Vec_Int_t * vCoOrder;
    Frc_Obj_t * pThis, * pNext;
    double CostThis, CostPrev;
    float * pVertX, VertX;
    int * pPermX, * pHandles;
    int k, h, Iter, iMinX, iMaxX, Counter, nCutStart, nCutCur, nCutCur2, nCutPrev;
    abctime clk = Abc_Clock(), clk2, clk2Total = 0;
    // create starting one-dimensional placement
    vCoOrder = Frc_ManCollectCos( p );
    if ( fRandomize )
        Frc_ManArrayShuffle( vCoOrder );
    nCutStart = Frc_ManPlaceDfsBoth( p, vCoOrder, &nCutCur2 );
    // refine placement
    CostPrev = 0.0;
    nCutPrev = nCutStart;
    pHandles = ABC_ALLOC( int, p->nObjs );
    pVertX   = ABC_ALLOC( float, p->nObjs );
    for ( Iter = 0; Iter < nIters; Iter++ )
    {
        // compute centers of hyperedges
        CostThis = 0.0;
        Frc_ManForEachObj( p, pThis, h )
        {
            iMinX = iMaxX = pThis->pPlace;
            Frc_ObjForEachFanout( pThis, pNext, k )
            {
                iMinX = Abc_MinInt( iMinX, pNext->pPlace );
                iMaxX = Abc_MaxInt( iMaxX, pNext->pPlace );
            }
            pThis->fEdgeCenter = 0.5 * (iMaxX + iMinX);
            CostThis += (iMaxX - iMinX);
        }
        // compute new centers of objects
        Counter = 0;
        Frc_ManForEachObj( p, pThis, h )
        {
            VertX = pThis->fEdgeCenter;
            Frc_ObjForEachFanin( pThis, pNext, k )
                VertX += pNext->fEdgeCenter;
            pVertX[Counter] = VertX / (Frc_ObjFaninNum(pThis) + 1);
            pHandles[Counter++] = h;
        }
        assert( Counter == Frc_ManObjNum(p) );
        // sort these numbers
        clk2 = Abc_Clock();
        pPermX = Gia_SortFloats( pVertX, pHandles, p->nObjs );
        clk2Total += Abc_Clock() - clk2;
        assert( pPermX == pHandles );
        Vec_IntClear( vCoOrder );
        for ( k = 0; k < p->nObjs; k++ )
        {
            pThis = Frc_ManObj( p, pPermX[k] );
            pThis->pPlace = k;
            if ( Frc_ObjIsCo(pThis) )
                Vec_IntPush( vCoOrder, pThis->hHandle );
        }
/*
        printf( "Ordering of PIs:\n" );
        Frc_ManForEachCi( p, pThis, k )
            printf( "PI number = %7d.  Object handle = %7d,  Coordinate = %7d.\n", 
                k, pThis->hHandle, pThis->pPlace );
*/
        nCutCur = Frc_ManPlaceDfsBoth( p, vCoOrder, &nCutCur2 );
        // evaluate cost
        if ( fVerbose )
        {
            printf( "%2d : Span = %e  ", Iter+1, CostThis );
            printf( "Cut = %6d  (%5.2f %%)  CutR = %6d  ", nCutCur, 100.0*(nCutStart-nCutCur)/nCutStart, nCutCur2 );
            ABC_PRTn( "Total", Abc_Clock() - clk );
            ABC_PRT( "Sort", clk2Total );
//        Frc_ManCrossCutTest( p, vCoOrder );
        }
//        if ( 1.0 * nCutPrev / nCutCur < 1.001 )
//            break;
        nCutPrev = nCutCur;
    }
    ABC_FREE( pHandles );
    ABC_FREE( pVertX );
    Vec_IntFree( vCoOrder );
}